

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O0

void EvaluateNode(size_t block_start,size_t pos,size_t max_backward_limit,size_t gap,
                 int *starting_dist_cache,ZopfliCostModel *model,StartPosQueue *queue,
                 ZopfliNode *nodes)

{
  uint32_t uVar1;
  undefined1 local_90 [8];
  PosData posdata;
  float node_cost;
  ZopfliCostModel *model_local;
  int *starting_dist_cache_local;
  size_t gap_local;
  size_t max_backward_limit_local;
  size_t pos_local;
  size_t block_start_local;
  
  posdata.cost = nodes[pos].u.cost;
  uVar1 = ComputeDistanceShortcut(block_start,pos,max_backward_limit,gap,nodes);
  nodes[pos].u.next = uVar1;
  if (posdata.cost <= model->literal_costs_[pos] - *model->literal_costs_) {
    posdata.distance_cache[3] = (int)posdata.cost;
    posdata.distance_cache[2] =
         (int)(posdata.cost - (model->literal_costs_[pos] - *model->literal_costs_));
    local_90 = (undefined1  [8])pos;
    ComputeDistanceCache(pos,starting_dist_cache,nodes,(int *)&posdata);
    StartPosQueuePush(queue,(PosData *)local_90);
  }
  return;
}

Assistant:

static void EvaluateNode(
    const size_t block_start, const size_t pos, const size_t max_backward_limit,
    const size_t gap, const int* starting_dist_cache,
    const ZopfliCostModel* model, StartPosQueue* queue, ZopfliNode* nodes) {
  /* Save cost, because ComputeDistanceCache invalidates it. */
  float node_cost = nodes[pos].u.cost;
  nodes[pos].u.shortcut = ComputeDistanceShortcut(
      block_start, pos, max_backward_limit, gap, nodes);
  if (node_cost <= ZopfliCostModelGetLiteralCosts(model, 0, pos)) {
    PosData posdata;
    posdata.pos = pos;
    posdata.cost = node_cost;
    posdata.costdiff = node_cost -
        ZopfliCostModelGetLiteralCosts(model, 0, pos);
    ComputeDistanceCache(
        pos, starting_dist_cache, nodes, posdata.distance_cache);
    StartPosQueuePush(queue, &posdata);
  }
}